

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O1

DoubleForm resolveFormat(int precision,int decpt,qsizetype length)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  
  if (precision == -0x80) {
    lVar1 = (long)decpt;
    uVar4 = 4 - (decpt < 1 && length == 1);
    uVar2 = 5;
    if (length < 2) {
      uVar2 = uVar4;
    }
    if (lVar1 < length) {
      uVar2 = uVar4;
    }
    if (decpt < 1) {
      bVar3 = 1 - decpt <= (int)uVar2;
    }
    else {
      bVar3 = true;
      if (length < lVar1) {
        bVar3 = lVar1 <= (long)((ulong)uVar2 + length);
      }
    }
  }
  else {
    bVar3 = decpt <= (int)(precision + (uint)(precision == 0)) && -4 < decpt;
  }
  return (DoubleForm)bVar3;
}

Assistant:

static QLocaleData::DoubleForm resolveFormat(int precision, int decpt, qsizetype length)
{
    bool useDecimal;
    if (precision == QLocale::FloatingPointShortest) {
        // Find out which representation is shorter.
        // Set bias to everything added to exponent form but not
        // decimal, minus the converse.

        // Exponent adds separator, sign and two exponents:
        int bias = 2 + 2;
        if (length <= decpt && length > 1)
            ++bias;
        else if (length == 1 && decpt <= 0)
            --bias;

        // When 0 < decpt <= length, the forms have equal digit
        // counts, plus things bias has taken into account;
        // otherwise decimal form's digit count is right-padded with
        // zeros to decpt, when decpt is positive, otherwise it's
        // left-padded with 1 - decpt zeros.
        if (decpt <= 0)
            useDecimal = 1 - decpt <= bias;
        else if (decpt <= length)
            useDecimal = true;
        else
            useDecimal = decpt <= length + bias;
    } else {
        // X == decpt - 1, POSIX's P; -4 <= X < P iff -4 < decpt <= P
        Q_ASSERT(precision >= 0);
        useDecimal = decpt > -4 && decpt <= (precision ? precision : 1);
    }
    return useDecimal ? QLocaleData::DFDecimal : QLocaleData::DFExponent;
}